

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane-test.c++
# Opt level: O2

Promise<void> __thiscall
capnp::_::anon_unknown_0::ThingImpl::intercept(ThingImpl *this,InterceptContext context)

{
  CallContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
  local_60;
  Maybe<capnp::MessageSize> local_58;
  Builder local_40;
  
  local_58.ptr.isSet = false;
  CallContext<capnproto_test::capnp::test::TestMembrane::Thing::InterceptParams,_capnproto_test::capnp::test::TestMembrane::Result>
  ::getResults(&local_40,&local_60,&local_58);
  capnproto_test::capnp::test::TestMembrane::Result::Builder::setText
            (&local_40,(StringPtr)*(StringPtr *)&context.hook[1]._vptr_CallContextHook);
  kj::_::ReadyNow::operator_cast_to_Promise((ReadyNow *)this);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> intercept(InterceptContext context) override {
    context.getResults().setText(text);
    return kj::READY_NOW;
  }